

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_>
spdlog::details::
make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>,std::__cxx11::string_const&>
          (unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
           *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  populator_set *populators;
  string *in_RDX;
  json_formatter *in_RSI;
  json_formatter *in_RDI;
  _Head_base<0UL,_spdlog::json_formatter_*,_false> eol;
  string local_38 [32];
  string *local_18;
  json_formatter *local_10;
  
  eol._M_head_impl = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  populators = (populator_set *)operator_new(0x60);
  std::__cxx11::string::string(local_38,local_18);
  json_formatter::json_formatter(local_10,populators,(string *)eol._M_head_impl);
  std::unique_ptr<spdlog::json_formatter,std::default_delete<spdlog::json_formatter>>::
  unique_ptr<std::default_delete<spdlog::json_formatter>,void>
            ((unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> *)
             eol._M_head_impl,in_RDI);
  std::__cxx11::string::~string(local_38);
  return (__uniq_ptr_data<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>,_true,_true>
          )(tuple<spdlog::json_formatter_*,_std::default_delete<spdlog::json_formatter>_>)
           eol._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}